

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O2

int Dar_ObjCutLevelAchieved(Vec_Ptr_t *vCut,int nLevelMin)

{
  void *pvVar1;
  int i;
  
  i = 0;
  while( true ) {
    if (vCut->nSize <= i) {
      return 0;
    }
    pvVar1 = Vec_PtrEntry(vCut,i);
    if ((((uint)*(undefined8 *)((long)pvVar1 + 0x18) & 7) != 2) &&
       ((int)((uint)((ulong)*(undefined8 *)((long)pvVar1 + 0x18) >> 0x20) & 0xffffff) <= nLevelMin))
    break;
    i = i + 1;
  }
  return 1;
}

Assistant:

int Dar_ObjCutLevelAchieved( Vec_Ptr_t * vCut, int nLevelMin )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
        if ( !Aig_ObjIsCi(pObj) && (int)pObj->Level <= nLevelMin )
            return 1;
    return 0;
}